

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonteCarloPricer.h
# Opt level: O0

void __thiscall
MonteCarloPricer::priceAndPrint<AsianArithmeticPut>
          (MonteCarloPricer *this,BlackScholesModel *model,AsianArithmeticPut *option)

{
  ostream *poVar1;
  PriceCI local_38;
  AsianArithmeticPut *local_20;
  AsianArithmeticPut *option_local;
  BlackScholesModel *model_local;
  MonteCarloPricer *this_local;
  
  local_20 = option;
  option_local = (AsianArithmeticPut *)model;
  model_local = (BlackScholesModel *)this;
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  BlackScholesModel::print((BlackScholesModel *)option_local);
  (**(local_20->super_PathDependentOption).super_Option._vptr_Option)();
  poVar1 = std::operator<<((ostream *)&std::cout," Number of paths: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->num_sims);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout," Number of steps: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->n_steps);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  price<AsianArithmeticPut>(&local_38,this,(BlackScholesModel *)option_local,local_20);
  PriceCI::print_CI(&local_38);
  return;
}

Assistant:

inline void MonteCarloPricer::priceAndPrint(BlackScholesModel const& model, T const& option)
{
	std::cout << std::endl;
	model.print();
	option.print();
	std::cout << " Number of paths: " << num_sims << std::endl;
	std::cout << " Number of steps: " << n_steps << std::endl;
	price(model, option).print_CI();
}